

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall ncnn::Extractor::Extractor(Extractor *this,Net *_net,int blob_count)

{
  undefined4 in_EDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Option *in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  
  *(vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> **)in_RDI = in_RSI;
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::vector
            ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x131671);
  Option::Option(in_RDI);
  std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
            (in_RSI,CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  memcpy(&in_RDI->use_int8_arithmetic,*(void **)in_RDI,0x22);
  return;
}

Assistant:

Extractor::Extractor(const Net* _net, int blob_count) : net(_net)
{
    blob_mats.resize(blob_count);
    opt = net->opt;

#if NCNN_VULKAN
    if (net->opt.use_vulkan_compute)
    {
        blob_mats_gpu.resize(blob_count);
    }
#endif // NCNN_VULKAN
}